

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
edition_unittest::EnumParseTester::_InternalSerialize
          (EnumParseTester *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  EnumParseTester_SeqSmall0 EVar2;
  uint uVar3;
  int iVar4;
  EnumParseTester_SeqSmall1 EVar5;
  EnumParseTester_SeqLarge EVar6;
  EnumParseTester_Arbitrary EVar7;
  int32_t value;
  uint uVar8;
  uint32_t *puVar9;
  uint8_t *puVar10;
  RepeatedField<int> *pRVar11;
  const_pointer piVar12;
  LogMessage *pLVar13;
  EnumParseTester *extendee;
  UnknownFieldSet *unknown_fields;
  const_pointer piVar14;
  size_t byte_size_23;
  size_t byte_size_22;
  size_t byte_size_21;
  size_t byte_size_20;
  size_t byte_size_19;
  size_t byte_size_18;
  size_t byte_size_17;
  size_t byte_size_16;
  size_t byte_size_15;
  size_t byte_size_14;
  size_t byte_size_13;
  size_t byte_size_12;
  size_t byte_size_11;
  size_t byte_size_10;
  size_t byte_size_9;
  size_t byte_size_8;
  size_t byte_size_7;
  size_t byte_size_6;
  size_t byte_size_5;
  size_t byte_size_4;
  size_t byte_size_3;
  size_t byte_size_2;
  size_t byte_size_1;
  size_t byte_size;
  uint32_t cached_has_bits;
  EnumParseTester *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  EnumParseTester *this_local;
  const_pointer end;
  const_pointer it;
  EpsCopyOutputStream *local_1138;
  byte *local_1110;
  ulong local_1108;
  const_pointer end_1;
  const_pointer it_1;
  EpsCopyOutputStream *local_10e8;
  byte *local_10c0;
  ulong local_10b8;
  const_pointer end_2;
  const_pointer it_2;
  EpsCopyOutputStream *local_1098;
  byte *local_1070;
  ulong local_1068;
  const_pointer end_3;
  const_pointer it_3;
  EpsCopyOutputStream *local_1048;
  byte *local_1020;
  ulong local_1018;
  const_pointer end_4;
  const_pointer it_4;
  EpsCopyOutputStream *local_ff8;
  byte *local_fd0;
  ulong local_fc8;
  const_pointer end_5;
  const_pointer it_5;
  EpsCopyOutputStream *local_fa8;
  byte *local_f80;
  ulong local_f78;
  const_pointer end_6;
  const_pointer it_6;
  EpsCopyOutputStream *local_f58;
  byte *local_f30;
  ulong local_f28;
  const_pointer end_7;
  const_pointer it_7;
  EpsCopyOutputStream *local_f08;
  byte *local_ee0;
  ulong local_ed8;
  const_pointer end_8;
  const_pointer it_8;
  EpsCopyOutputStream *local_eb8;
  byte *local_e90;
  ulong local_e88;
  const_pointer end_9;
  const_pointer it_9;
  EpsCopyOutputStream *local_e68;
  byte *local_e40;
  ulong local_e38;
  const_pointer end_10;
  const_pointer it_10;
  EpsCopyOutputStream *local_e18;
  byte *local_df0;
  ulong local_de8;
  const_pointer end_11;
  const_pointer it_11;
  EpsCopyOutputStream *local_dc8;
  byte *local_da0;
  ulong local_d98;
  const_pointer end_12;
  const_pointer it_12;
  EpsCopyOutputStream *local_d78;
  byte *local_d50;
  ulong local_d48;
  const_pointer end_13;
  const_pointer it_13;
  EpsCopyOutputStream *local_d28;
  byte *local_d00;
  ulong local_cf8;
  const_pointer end_14;
  const_pointer it_14;
  EpsCopyOutputStream *local_cd8;
  byte *local_cb0;
  ulong local_ca8;
  const_pointer end_15;
  const_pointer it_15;
  EpsCopyOutputStream *local_c88;
  byte *local_c60;
  ulong local_c58;
  const_pointer end_16;
  const_pointer it_16;
  EpsCopyOutputStream *local_c38;
  byte *local_c10;
  ulong local_c08;
  const_pointer end_17;
  const_pointer it_17;
  EpsCopyOutputStream *local_be8;
  byte *local_bc0;
  ulong local_bb8;
  const_pointer end_18;
  const_pointer it_18;
  EpsCopyOutputStream *local_b98;
  byte *local_b70;
  ulong local_b68;
  const_pointer end_19;
  const_pointer it_19;
  EpsCopyOutputStream *local_b48;
  byte *local_b20;
  ulong local_b18;
  const_pointer end_20;
  const_pointer it_20;
  EpsCopyOutputStream *local_af8;
  byte *local_ad0;
  ulong local_ac8;
  const_pointer end_21;
  const_pointer it_21;
  EpsCopyOutputStream *local_aa8;
  byte *local_a80;
  ulong local_a78;
  const_pointer end_22;
  const_pointer it_22;
  EpsCopyOutputStream *local_a58;
  byte *local_a30;
  ulong local_a28;
  const_pointer end_23;
  const_pointer it_23;
  EpsCopyOutputStream *local_a08;
  byte *local_9e0;
  ulong local_9d8;
  LogMessage local_788;
  Voidify local_771;
  byte *local_770;
  undefined4 local_768;
  undefined4 local_764;
  EpsCopyOutputStream *local_760;
  byte *local_758;
  uint local_750;
  byte local_749;
  LogMessage local_748;
  Voidify local_731;
  byte *local_730;
  uint local_728;
  int local_724;
  EpsCopyOutputStream *local_720;
  byte *local_718;
  uint local_710;
  byte local_709;
  LogMessage local_708;
  Voidify local_6f1;
  byte *local_6f0;
  uint local_6e8;
  int local_6e4;
  EpsCopyOutputStream *local_6e0;
  byte *local_6d8;
  uint local_6d0;
  byte local_6c9;
  LogMessage local_6c8;
  Voidify local_6b1;
  byte *local_6b0;
  uint local_6a8;
  int local_6a4;
  EpsCopyOutputStream *local_6a0;
  byte *local_698;
  uint local_690;
  byte local_689;
  LogMessage local_688;
  Voidify local_671;
  byte *local_670;
  uint local_668;
  int local_664;
  EpsCopyOutputStream *local_660;
  byte *local_658;
  uint local_650;
  byte local_649;
  LogMessage local_648;
  Voidify local_631;
  byte *local_630;
  uint local_628;
  int local_624;
  EpsCopyOutputStream *local_620;
  byte *local_618;
  uint local_610;
  byte local_609;
  LogMessage local_608;
  Voidify local_5f1;
  byte *local_5f0;
  uint local_5e8;
  int local_5e4;
  EpsCopyOutputStream *local_5e0;
  byte *local_5d8;
  uint local_5d0;
  byte local_5c9;
  LogMessage local_5c8;
  Voidify local_5b1;
  byte *local_5b0;
  uint local_5a8;
  int local_5a4;
  EpsCopyOutputStream *local_5a0;
  byte *local_598;
  uint local_590;
  byte local_589;
  LogMessage local_588;
  Voidify local_571;
  byte *local_570;
  uint local_568;
  int local_564;
  EpsCopyOutputStream *local_560;
  byte *local_558;
  uint local_550;
  byte local_549;
  LogMessage local_548;
  Voidify local_531;
  byte *local_530;
  uint local_528;
  int local_524;
  EpsCopyOutputStream *local_520;
  byte *local_518;
  uint local_510;
  byte local_509;
  LogMessage local_508;
  Voidify local_4f1;
  byte *local_4f0;
  uint local_4e8;
  int local_4e4;
  EpsCopyOutputStream *local_4e0;
  byte *local_4d8;
  uint local_4d0;
  byte local_4c9;
  LogMessage local_4c8;
  Voidify local_4b1;
  byte *local_4b0;
  uint local_4a8;
  int local_4a4;
  EpsCopyOutputStream *local_4a0;
  byte *local_498;
  uint local_490;
  byte local_489;
  LogMessage local_488;
  Voidify local_471;
  byte *local_470;
  uint local_468;
  int local_464;
  EpsCopyOutputStream *local_460;
  byte *local_458;
  uint local_450;
  byte local_449;
  LogMessage local_448;
  Voidify local_431;
  byte *local_430;
  uint local_428;
  int local_424;
  EpsCopyOutputStream *local_420;
  byte *local_418;
  uint local_410;
  byte local_409;
  LogMessage local_408;
  Voidify local_3f1;
  byte *local_3f0;
  uint local_3e8;
  int local_3e4;
  EpsCopyOutputStream *local_3e0;
  byte *local_3d8;
  uint local_3d0;
  byte local_3c9;
  LogMessage local_3c8;
  Voidify local_3b1;
  byte *local_3b0;
  uint local_3a8;
  int local_3a4;
  EpsCopyOutputStream *local_3a0;
  byte *local_398;
  uint local_390;
  byte local_389;
  LogMessage local_388;
  Voidify local_371;
  byte *local_370;
  uint local_368;
  int local_364;
  EpsCopyOutputStream *local_360;
  byte *local_358;
  uint local_350;
  byte local_349;
  LogMessage local_348;
  Voidify local_331;
  byte *local_330;
  uint local_328;
  int local_324;
  EpsCopyOutputStream *local_320;
  byte *local_318;
  uint local_310;
  byte local_309;
  LogMessage local_308;
  Voidify local_2f1;
  byte *local_2f0;
  uint local_2e8;
  int local_2e4;
  EpsCopyOutputStream *local_2e0;
  byte *local_2d8;
  uint local_2d0;
  byte local_2c9;
  LogMessage local_2c8;
  Voidify local_2b1;
  byte *local_2b0;
  uint local_2a8;
  int local_2a4;
  EpsCopyOutputStream *local_2a0;
  byte *local_298;
  uint local_290;
  byte local_289;
  LogMessage local_288;
  Voidify local_271;
  byte *local_270;
  uint local_268;
  int local_264;
  EpsCopyOutputStream *local_260;
  byte *local_258;
  uint local_250;
  byte local_249;
  LogMessage local_248;
  Voidify local_231;
  byte *local_230;
  uint local_228;
  int local_224;
  EpsCopyOutputStream *local_220;
  byte *local_218;
  uint local_210;
  byte local_209;
  LogMessage local_208;
  Voidify local_1f1;
  byte *local_1f0;
  uint local_1e8;
  int local_1e4;
  EpsCopyOutputStream *local_1e0;
  byte *local_1d8;
  uint local_1d0;
  byte local_1c9;
  LogMessage local_1c8;
  Voidify local_1b1;
  byte *local_1b0;
  uint local_1a8;
  int local_1a4;
  EpsCopyOutputStream *local_1a0;
  byte *local_198;
  uint local_18c;
  EpsCopyOutputStream *local_188;
  uint local_17c;
  EpsCopyOutputStream *local_178;
  uint local_16c;
  EpsCopyOutputStream *local_168;
  uint local_15c;
  EpsCopyOutputStream *local_158;
  uint local_14c;
  EpsCopyOutputStream *local_148;
  uint local_13c;
  EpsCopyOutputStream *local_138;
  uint local_12c;
  EpsCopyOutputStream *local_128;
  uint local_11c;
  EpsCopyOutputStream *local_118;
  uint local_10c;
  EpsCopyOutputStream *local_108;
  uint local_fc;
  EpsCopyOutputStream *local_f8;
  uint local_ec;
  EpsCopyOutputStream *local_e8;
  uint local_dc;
  EpsCopyOutputStream *local_d8;
  uint local_cc;
  EpsCopyOutputStream *local_c8;
  uint local_bc;
  EpsCopyOutputStream *local_b8;
  uint local_ac;
  EpsCopyOutputStream *local_a8;
  uint local_9c;
  EpsCopyOutputStream *local_98;
  uint local_8c;
  EpsCopyOutputStream *local_88;
  uint local_7c;
  EpsCopyOutputStream *local_78;
  uint local_6c;
  EpsCopyOutputStream *local_68;
  uint local_5c;
  EpsCopyOutputStream *local_58;
  uint local_4c;
  EpsCopyOutputStream *local_48;
  uint local_3c;
  EpsCopyOutputStream *local_38;
  uint local_2c;
  EpsCopyOutputStream *local_28;
  uint local_1c;
  EpsCopyOutputStream *local_18;
  uint local_c;
  
  puVar9 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar8 = *puVar9;
  stream_local = (EpsCopyOutputStream *)target;
  if ((uVar8 & 1) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    EVar2 = _internal_optional_seq_small_0_lowfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(1,EVar2,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_small_0_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_small_0_lowfield(this);
    local_770 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_764 = 2;
    local_768 = 2;
    local_760 = stream;
    if (stream->end_ <= local_770) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_788,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_788);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_771,pLVar13);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_788);
    }
    local_750 = 0x12;
    local_758 = local_770;
    while (0x7f < local_750) {
      *local_758 = (byte)local_750 | 0x80;
      local_758 = local_758 + 1;
      local_750 = 0;
    }
    *local_758 = (byte)local_750;
    local_188 = (EpsCopyOutputStream *)(local_758 + 1);
    for (local_17c = uVar3; 0x7f < local_17c; local_17c = local_17c >> 7) {
      *(byte *)local_188 = (byte)local_17c | 0x80;
      local_188 = (EpsCopyOutputStream *)((long)local_188 + 1);
    }
    local_1138 = (EpsCopyOutputStream *)((long)local_188 + 1);
    *(byte *)local_188 = (byte)local_17c;
    local_758 = local_758 + 1;
    local_188 = local_1138;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end = piVar12;
    do {
      local_1110 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             (stream,(uint8_t *)local_1138);
      piVar14 = end + 1;
      for (local_1108 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end);
          0x7f < local_1108; local_1108 = local_1108 >> 7) {
        *local_1110 = (byte)local_1108 | 0x80;
        local_1110 = local_1110 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_1110 + 1);
      *local_1110 = (byte)local_1108;
      end = piVar14;
      local_1138 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_small_0_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_small_0_lowfield(this);
    local_730 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_724 = 3;
    local_728 = 2;
    local_749 = 0;
    local_720 = stream;
    if (stream->end_ <= local_730) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_748,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_749 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_748);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_731,pLVar13);
    }
    if ((local_749 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_748);
    }
    local_718 = local_730;
    for (local_710 = local_724 << 3 | local_728; 0x7f < local_710; local_710 = local_710 >> 7) {
      *local_718 = (byte)local_710 | 0x80;
      local_718 = local_718 + 1;
    }
    *local_718 = (byte)local_710;
    local_178 = (EpsCopyOutputStream *)(local_718 + 1);
    for (local_16c = uVar3; 0x7f < local_16c; local_16c = local_16c >> 7) {
      *(byte *)local_178 = (byte)local_16c | 0x80;
      local_178 = (EpsCopyOutputStream *)((long)local_178 + 1);
    }
    local_10e8 = (EpsCopyOutputStream *)((long)local_178 + 1);
    *(byte *)local_178 = (byte)local_16c;
    local_718 = local_718 + 1;
    local_178 = local_10e8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_1 = piVar12;
    do {
      local_10c0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             (stream,(uint8_t *)local_10e8);
      piVar14 = end_1 + 1;
      for (local_10b8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_1);
          0x7f < local_10b8; local_10b8 = local_10b8 >> 7) {
        *local_10c0 = (byte)local_10b8 | 0x80;
        local_10c0 = local_10c0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_10c0 + 1);
      *local_10c0 = (byte)local_10b8;
      end_1 = piVar14;
      local_10e8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 2) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar5 = _internal_optional_seq_small_1_lowfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(4,EVar5,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_small_1_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_small_1_lowfield(this);
    local_6f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_6e4 = 5;
    local_6e8 = 2;
    local_709 = 0;
    local_6e0 = stream;
    if (stream->end_ <= local_6f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_708,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_709 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_708);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_6f1,pLVar13);
    }
    if ((local_709 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_708);
    }
    local_6d8 = local_6f0;
    for (local_6d0 = local_6e4 << 3 | local_6e8; 0x7f < local_6d0; local_6d0 = local_6d0 >> 7) {
      *local_6d8 = (byte)local_6d0 | 0x80;
      local_6d8 = local_6d8 + 1;
    }
    *local_6d8 = (byte)local_6d0;
    local_168 = (EpsCopyOutputStream *)(local_6d8 + 1);
    for (local_15c = uVar3; 0x7f < local_15c; local_15c = local_15c >> 7) {
      *(byte *)local_168 = (byte)local_15c | 0x80;
      local_168 = (EpsCopyOutputStream *)((long)local_168 + 1);
    }
    local_1098 = (EpsCopyOutputStream *)((long)local_168 + 1);
    *(byte *)local_168 = (byte)local_15c;
    local_6d8 = local_6d8 + 1;
    local_168 = local_1098;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_2 = piVar12;
    do {
      local_1070 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             (stream,(uint8_t *)local_1098);
      piVar14 = end_2 + 1;
      for (local_1068 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_2);
          0x7f < local_1068; local_1068 = local_1068 >> 7) {
        *local_1070 = (byte)local_1068 | 0x80;
        local_1070 = local_1070 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_1070 + 1);
      *local_1070 = (byte)local_1068;
      end_2 = piVar14;
      local_1098 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_small_1_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_small_1_lowfield(this);
    local_6b0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_6a4 = 6;
    local_6a8 = 2;
    local_6c9 = 0;
    local_6a0 = stream;
    if (stream->end_ <= local_6b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_6c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_6c9 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_6c8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_6b1,pLVar13);
    }
    if ((local_6c9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_6c8);
    }
    local_698 = local_6b0;
    for (local_690 = local_6a4 << 3 | local_6a8; 0x7f < local_690; local_690 = local_690 >> 7) {
      *local_698 = (byte)local_690 | 0x80;
      local_698 = local_698 + 1;
    }
    *local_698 = (byte)local_690;
    local_158 = (EpsCopyOutputStream *)(local_698 + 1);
    for (local_14c = uVar3; 0x7f < local_14c; local_14c = local_14c >> 7) {
      *(byte *)local_158 = (byte)local_14c | 0x80;
      local_158 = (EpsCopyOutputStream *)((long)local_158 + 1);
    }
    local_1048 = (EpsCopyOutputStream *)((long)local_158 + 1);
    *(byte *)local_158 = (byte)local_14c;
    local_698 = local_698 + 1;
    local_158 = local_1048;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_3 = piVar12;
    do {
      local_1020 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                             (stream,(uint8_t *)local_1048);
      piVar14 = end_3 + 1;
      for (local_1018 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_3);
          0x7f < local_1018; local_1018 = local_1018 >> 7) {
        *local_1020 = (byte)local_1018 | 0x80;
        local_1020 = local_1020 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_1020 + 1);
      *local_1020 = (byte)local_1018;
      end_3 = piVar14;
      local_1048 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x80) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar6 = _internal_optional_seq_large_lowfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(7,EVar6,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_large_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_large_lowfield(this);
    local_670 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_664 = 8;
    local_668 = 2;
    local_689 = 0;
    local_660 = stream;
    if (stream->end_ <= local_670) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_688,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_689 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_688);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_671,pLVar13);
    }
    if ((local_689 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_688);
    }
    local_658 = local_670;
    for (local_650 = local_664 << 3 | local_668; 0x7f < local_650; local_650 = local_650 >> 7) {
      *local_658 = (byte)local_650 | 0x80;
      local_658 = local_658 + 1;
    }
    *local_658 = (byte)local_650;
    local_148 = (EpsCopyOutputStream *)(local_658 + 1);
    for (local_13c = uVar3; 0x7f < local_13c; local_13c = local_13c >> 7) {
      *(byte *)local_148 = (byte)local_13c | 0x80;
      local_148 = (EpsCopyOutputStream *)((long)local_148 + 1);
    }
    local_ff8 = (EpsCopyOutputStream *)((long)local_148 + 1);
    *(byte *)local_148 = (byte)local_13c;
    local_658 = local_658 + 1;
    local_148 = local_ff8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_4 = piVar12;
    do {
      local_fd0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_ff8);
      piVar14 = end_4 + 1;
      for (local_fc8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_4);
          0x7f < local_fc8; local_fc8 = local_fc8 >> 7) {
        *local_fd0 = (byte)local_fc8 | 0x80;
        local_fd0 = local_fd0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_fd0 + 1);
      *local_fd0 = (byte)local_fc8;
      end_4 = piVar14;
      local_ff8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_large_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_large_lowfield(this);
    local_630 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_624 = 9;
    local_628 = 2;
    local_649 = 0;
    local_620 = stream;
    if (stream->end_ <= local_630) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_648,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_649 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_648);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_631,pLVar13);
    }
    if ((local_649 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_648);
    }
    local_618 = local_630;
    for (local_610 = local_624 << 3 | local_628; 0x7f < local_610; local_610 = local_610 >> 7) {
      *local_618 = (byte)local_610 | 0x80;
      local_618 = local_618 + 1;
    }
    *local_618 = (byte)local_610;
    local_138 = (EpsCopyOutputStream *)(local_618 + 1);
    for (local_12c = uVar3; 0x7f < local_12c; local_12c = local_12c >> 7) {
      *(byte *)local_138 = (byte)local_12c | 0x80;
      local_138 = (EpsCopyOutputStream *)((long)local_138 + 1);
    }
    local_fa8 = (EpsCopyOutputStream *)((long)local_138 + 1);
    *(byte *)local_138 = (byte)local_12c;
    local_618 = local_618 + 1;
    local_138 = local_fa8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_5 = piVar12;
    do {
      local_f80 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_fa8);
      piVar14 = end_5 + 1;
      for (local_f78 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_5);
          0x7f < local_f78; local_f78 = local_f78 >> 7) {
        *local_f80 = (byte)local_f78 | 0x80;
        local_f80 = local_f80 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_f80 + 1);
      *local_f80 = (byte)local_f78;
      end_5 = piVar14;
      local_fa8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x100) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar7 = _internal_optional_arbitrary_lowfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(10,EVar7,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_arbitrary_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_arbitrary_lowfield(this);
    local_5f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_5e4 = 0xb;
    local_5e8 = 2;
    local_609 = 0;
    local_5e0 = stream;
    if (stream->end_ <= local_5f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_608,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_609 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_608);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_5f1,pLVar13);
    }
    if ((local_609 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_608);
    }
    local_5d8 = local_5f0;
    for (local_5d0 = local_5e4 << 3 | local_5e8; 0x7f < local_5d0; local_5d0 = local_5d0 >> 7) {
      *local_5d8 = (byte)local_5d0 | 0x80;
      local_5d8 = local_5d8 + 1;
    }
    *local_5d8 = (byte)local_5d0;
    local_128 = (EpsCopyOutputStream *)(local_5d8 + 1);
    for (local_11c = uVar3; 0x7f < local_11c; local_11c = local_11c >> 7) {
      *(byte *)local_128 = (byte)local_11c | 0x80;
      local_128 = (EpsCopyOutputStream *)((long)local_128 + 1);
    }
    local_f58 = (EpsCopyOutputStream *)((long)local_128 + 1);
    *(byte *)local_128 = (byte)local_11c;
    local_5d8 = local_5d8 + 1;
    local_128 = local_f58;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_6 = piVar12;
    do {
      local_f30 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_f58);
      piVar14 = end_6 + 1;
      for (local_f28 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_6);
          0x7f < local_f28; local_f28 = local_f28 >> 7) {
        *local_f30 = (byte)local_f28 | 0x80;
        local_f30 = local_f30 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_f30 + 1);
      *local_f30 = (byte)local_f28;
      end_6 = piVar14;
      local_f58 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_arbitrary_lowfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_arbitrary_lowfield(this);
    local_5b0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_5a4 = 0xc;
    local_5a8 = 2;
    local_5c9 = 0;
    local_5a0 = stream;
    if (stream->end_ <= local_5b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_5c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_5c9 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_5c8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_5b1,pLVar13);
    }
    if ((local_5c9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_5c8);
    }
    local_598 = local_5b0;
    for (local_590 = local_5a4 << 3 | local_5a8; 0x7f < local_590; local_590 = local_590 >> 7) {
      *local_598 = (byte)local_590 | 0x80;
      local_598 = local_598 + 1;
    }
    *local_598 = (byte)local_590;
    local_118 = (EpsCopyOutputStream *)(local_598 + 1);
    for (local_10c = uVar3; 0x7f < local_10c; local_10c = local_10c >> 7) {
      *(byte *)local_118 = (byte)local_10c | 0x80;
      local_118 = (EpsCopyOutputStream *)((long)local_118 + 1);
    }
    local_f08 = (EpsCopyOutputStream *)((long)local_118 + 1);
    *(byte *)local_118 = (byte)local_10c;
    local_598 = local_598 + 1;
    local_118 = local_f08;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_7 = piVar12;
    do {
      local_ee0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_f08);
      piVar14 = end_7 + 1;
      for (local_ed8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_7);
          0x7f < local_ed8; local_ed8 = local_ed8 >> 7) {
        *local_ee0 = (byte)local_ed8 | 0x80;
        local_ee0 = local_ee0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_ee0 + 1);
      *local_ee0 = (byte)local_ed8;
      end_7 = piVar14;
      local_f08 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 4) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    value = _internal_other_field(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray(99,value,puVar10);
  }
  if ((uVar8 & 8) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar2 = _internal_optional_seq_small_0_midfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x3e9,EVar2,puVar10)
    ;
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_small_0_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_small_0_midfield(this);
    local_570 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_564 = 0x3ea;
    local_568 = 2;
    local_589 = 0;
    local_560 = stream;
    if (stream->end_ <= local_570) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_588,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_589 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_588);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_571,pLVar13);
    }
    if ((local_589 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_588);
    }
    local_558 = local_570;
    for (local_550 = local_564 << 3 | local_568; 0x7f < local_550; local_550 = local_550 >> 7) {
      *local_558 = (byte)local_550 | 0x80;
      local_558 = local_558 + 1;
    }
    *local_558 = (byte)local_550;
    local_108 = (EpsCopyOutputStream *)(local_558 + 1);
    for (local_fc = uVar3; 0x7f < local_fc; local_fc = local_fc >> 7) {
      *(byte *)local_108 = (byte)local_fc | 0x80;
      local_108 = (EpsCopyOutputStream *)((long)local_108 + 1);
    }
    local_eb8 = (EpsCopyOutputStream *)((long)local_108 + 1);
    *(byte *)local_108 = (byte)local_fc;
    local_558 = local_558 + 1;
    local_108 = local_eb8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_8 = piVar12;
    do {
      local_e90 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_eb8);
      piVar14 = end_8 + 1;
      for (local_e88 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_8);
          0x7f < local_e88; local_e88 = local_e88 >> 7) {
        *local_e90 = (byte)local_e88 | 0x80;
        local_e90 = local_e90 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_e90 + 1);
      *local_e90 = (byte)local_e88;
      end_8 = piVar14;
      local_eb8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_small_0_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_small_0_midfield(this);
    local_530 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_524 = 0x3eb;
    local_528 = 2;
    local_549 = 0;
    local_520 = stream;
    if (stream->end_ <= local_530) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_548,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_549 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_548);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_531,pLVar13);
    }
    if ((local_549 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_548);
    }
    local_518 = local_530;
    for (local_510 = local_524 << 3 | local_528; 0x7f < local_510; local_510 = local_510 >> 7) {
      *local_518 = (byte)local_510 | 0x80;
      local_518 = local_518 + 1;
    }
    *local_518 = (byte)local_510;
    local_f8 = (EpsCopyOutputStream *)(local_518 + 1);
    for (local_ec = uVar3; 0x7f < local_ec; local_ec = local_ec >> 7) {
      *(byte *)local_f8 = (byte)local_ec | 0x80;
      local_f8 = (EpsCopyOutputStream *)((long)local_f8 + 1);
    }
    local_e68 = (EpsCopyOutputStream *)((long)local_f8 + 1);
    *(byte *)local_f8 = (byte)local_ec;
    local_518 = local_518 + 1;
    local_f8 = local_e68;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_9 = piVar12;
    do {
      local_e40 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_e68);
      piVar14 = end_9 + 1;
      for (local_e38 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_9);
          0x7f < local_e38; local_e38 = local_e38 >> 7) {
        *local_e40 = (byte)local_e38 | 0x80;
        local_e40 = local_e40 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_e40 + 1);
      *local_e40 = (byte)local_e38;
      end_9 = piVar14;
      local_e68 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x40) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar5 = _internal_optional_seq_small_1_midfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x3ec,EVar5,puVar10)
    ;
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_small_1_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_small_1_midfield(this);
    local_4f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_4e4 = 0x3ed;
    local_4e8 = 2;
    local_509 = 0;
    local_4e0 = stream;
    if (stream->end_ <= local_4f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_508,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_509 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_508);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_4f1,pLVar13);
    }
    if ((local_509 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_508);
    }
    local_4d8 = local_4f0;
    for (local_4d0 = local_4e4 << 3 | local_4e8; 0x7f < local_4d0; local_4d0 = local_4d0 >> 7) {
      *local_4d8 = (byte)local_4d0 | 0x80;
      local_4d8 = local_4d8 + 1;
    }
    *local_4d8 = (byte)local_4d0;
    local_e8 = (EpsCopyOutputStream *)(local_4d8 + 1);
    for (local_dc = uVar3; 0x7f < local_dc; local_dc = local_dc >> 7) {
      *(byte *)local_e8 = (byte)local_dc | 0x80;
      local_e8 = (EpsCopyOutputStream *)((long)local_e8 + 1);
    }
    local_e18 = (EpsCopyOutputStream *)((long)local_e8 + 1);
    *(byte *)local_e8 = (byte)local_dc;
    local_4d8 = local_4d8 + 1;
    local_e8 = local_e18;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_10 = piVar12;
    do {
      local_df0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_e18);
      piVar14 = end_10 + 1;
      for (local_de8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_10);
          0x7f < local_de8; local_de8 = local_de8 >> 7) {
        *local_df0 = (byte)local_de8 | 0x80;
        local_df0 = local_df0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_df0 + 1);
      *local_df0 = (byte)local_de8;
      end_10 = piVar14;
      local_e18 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_small_1_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_small_1_midfield(this);
    local_4b0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_4a4 = 0x3ee;
    local_4a8 = 2;
    local_4c9 = 0;
    local_4a0 = stream;
    if (stream->end_ <= local_4b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_4c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_4c9 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_4c8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_4b1,pLVar13);
    }
    if ((local_4c9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_4c8);
    }
    local_498 = local_4b0;
    for (local_490 = local_4a4 << 3 | local_4a8; 0x7f < local_490; local_490 = local_490 >> 7) {
      *local_498 = (byte)local_490 | 0x80;
      local_498 = local_498 + 1;
    }
    *local_498 = (byte)local_490;
    local_d8 = (EpsCopyOutputStream *)(local_498 + 1);
    for (local_cc = uVar3; 0x7f < local_cc; local_cc = local_cc >> 7) {
      *(byte *)local_d8 = (byte)local_cc | 0x80;
      local_d8 = (EpsCopyOutputStream *)((long)local_d8 + 1);
    }
    local_dc8 = (EpsCopyOutputStream *)((long)local_d8 + 1);
    *(byte *)local_d8 = (byte)local_cc;
    local_498 = local_498 + 1;
    local_d8 = local_dc8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_11 = piVar12;
    do {
      local_da0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_dc8);
      piVar14 = end_11 + 1;
      for (local_d98 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_11);
          0x7f < local_d98; local_d98 = local_d98 >> 7) {
        *local_da0 = (byte)local_d98 | 0x80;
        local_da0 = local_da0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_da0 + 1);
      *local_da0 = (byte)local_d98;
      end_11 = piVar14;
      local_dc8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x200) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar6 = _internal_optional_seq_large_midfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x3ef,EVar6,puVar10)
    ;
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_large_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_large_midfield(this);
    local_470 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_464 = 0x3f0;
    local_468 = 2;
    local_489 = 0;
    local_460 = stream;
    if (stream->end_ <= local_470) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_488,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_489 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_488);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_471,pLVar13);
    }
    if ((local_489 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_488);
    }
    local_458 = local_470;
    for (local_450 = local_464 << 3 | local_468; 0x7f < local_450; local_450 = local_450 >> 7) {
      *local_458 = (byte)local_450 | 0x80;
      local_458 = local_458 + 1;
    }
    *local_458 = (byte)local_450;
    local_c8 = (EpsCopyOutputStream *)(local_458 + 1);
    for (local_bc = uVar3; 0x7f < local_bc; local_bc = local_bc >> 7) {
      *(byte *)local_c8 = (byte)local_bc | 0x80;
      local_c8 = (EpsCopyOutputStream *)((long)local_c8 + 1);
    }
    local_d78 = (EpsCopyOutputStream *)((long)local_c8 + 1);
    *(byte *)local_c8 = (byte)local_bc;
    local_458 = local_458 + 1;
    local_c8 = local_d78;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_12 = piVar12;
    do {
      local_d50 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_d78);
      piVar14 = end_12 + 1;
      for (local_d48 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_12);
          0x7f < local_d48; local_d48 = local_d48 >> 7) {
        *local_d50 = (byte)local_d48 | 0x80;
        local_d50 = local_d50 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_d50 + 1);
      *local_d50 = (byte)local_d48;
      end_12 = piVar14;
      local_d78 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_large_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_large_midfield(this);
    local_430 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_424 = 0x3f1;
    local_428 = 2;
    local_449 = 0;
    local_420 = stream;
    if (stream->end_ <= local_430) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_448,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_449 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_448);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_431,pLVar13);
    }
    if ((local_449 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_448);
    }
    local_418 = local_430;
    for (local_410 = local_424 << 3 | local_428; 0x7f < local_410; local_410 = local_410 >> 7) {
      *local_418 = (byte)local_410 | 0x80;
      local_418 = local_418 + 1;
    }
    *local_418 = (byte)local_410;
    local_b8 = (EpsCopyOutputStream *)(local_418 + 1);
    for (local_ac = uVar3; 0x7f < local_ac; local_ac = local_ac >> 7) {
      *(byte *)local_b8 = (byte)local_ac | 0x80;
      local_b8 = (EpsCopyOutputStream *)((long)local_b8 + 1);
    }
    local_d28 = (EpsCopyOutputStream *)((long)local_b8 + 1);
    *(byte *)local_b8 = (byte)local_ac;
    local_418 = local_418 + 1;
    local_b8 = local_d28;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_13 = piVar12;
    do {
      local_d00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_d28);
      piVar14 = end_13 + 1;
      for (local_cf8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_13);
          0x7f < local_cf8; local_cf8 = local_cf8 >> 7) {
        *local_d00 = (byte)local_cf8 | 0x80;
        local_d00 = local_d00 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_d00 + 1);
      *local_d00 = (byte)local_cf8;
      end_13 = piVar14;
      local_d28 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x400) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar7 = _internal_optional_arbitrary_midfield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray(0x3f2,EVar7,puVar10)
    ;
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_arbitrary_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_arbitrary_midfield(this);
    local_3f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_3e4 = 0x3f3;
    local_3e8 = 2;
    local_409 = 0;
    local_3e0 = stream;
    if (stream->end_ <= local_3f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_408,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_409 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_408);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_3f1,pLVar13);
    }
    if ((local_409 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_408);
    }
    local_3d8 = local_3f0;
    for (local_3d0 = local_3e4 << 3 | local_3e8; 0x7f < local_3d0; local_3d0 = local_3d0 >> 7) {
      *local_3d8 = (byte)local_3d0 | 0x80;
      local_3d8 = local_3d8 + 1;
    }
    *local_3d8 = (byte)local_3d0;
    local_a8 = (EpsCopyOutputStream *)(local_3d8 + 1);
    for (local_9c = uVar3; 0x7f < local_9c; local_9c = local_9c >> 7) {
      *(byte *)local_a8 = (byte)local_9c | 0x80;
      local_a8 = (EpsCopyOutputStream *)((long)local_a8 + 1);
    }
    local_cd8 = (EpsCopyOutputStream *)((long)local_a8 + 1);
    *(byte *)local_a8 = (byte)local_9c;
    local_3d8 = local_3d8 + 1;
    local_a8 = local_cd8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_14 = piVar12;
    do {
      local_cb0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_cd8);
      piVar14 = end_14 + 1;
      for (local_ca8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_14);
          0x7f < local_ca8; local_ca8 = local_ca8 >> 7) {
        *local_cb0 = (byte)local_ca8 | 0x80;
        local_cb0 = local_cb0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_cb0 + 1);
      *local_cb0 = (byte)local_ca8;
      end_14 = piVar14;
      local_cd8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_arbitrary_midfield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_arbitrary_midfield(this);
    local_3b0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_3a4 = 0x3f4;
    local_3a8 = 2;
    local_3c9 = 0;
    local_3a0 = stream;
    if (stream->end_ <= local_3b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_3c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_3c9 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_3c8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_3b1,pLVar13);
    }
    if ((local_3c9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_3c8);
    }
    local_398 = local_3b0;
    for (local_390 = local_3a4 << 3 | local_3a8; 0x7f < local_390; local_390 = local_390 >> 7) {
      *local_398 = (byte)local_390 | 0x80;
      local_398 = local_398 + 1;
    }
    *local_398 = (byte)local_390;
    local_98 = (EpsCopyOutputStream *)(local_398 + 1);
    for (local_8c = uVar3; 0x7f < local_8c; local_8c = local_8c >> 7) {
      *(byte *)local_98 = (byte)local_8c | 0x80;
      local_98 = (EpsCopyOutputStream *)((long)local_98 + 1);
    }
    local_c88 = (EpsCopyOutputStream *)((long)local_98 + 1);
    *(byte *)local_98 = (byte)local_8c;
    local_398 = local_398 + 1;
    local_98 = local_c88;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_15 = piVar12;
    do {
      local_c60 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_c88);
      piVar14 = end_15 + 1;
      for (local_c58 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_15);
          0x7f < local_c58; local_c58 = local_c58 >> 7) {
        *local_c60 = (byte)local_c58 | 0x80;
        local_c60 = local_c60 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_c60 + 1);
      *local_c60 = (byte)local_c58;
      end_15 = piVar14;
      local_c88 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x10) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar2 = _internal_optional_seq_small_0_hifield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (0xf4241,EVar2,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_small_0_hifield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_small_0_hifield(this);
    local_370 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_364 = 0xf4242;
    local_368 = 2;
    local_389 = 0;
    local_360 = stream;
    if (stream->end_ <= local_370) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_388,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_389 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_388);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_371,pLVar13);
    }
    if ((local_389 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_388);
    }
    local_358 = local_370;
    for (local_350 = local_364 << 3 | local_368; 0x7f < local_350; local_350 = local_350 >> 7) {
      *local_358 = (byte)local_350 | 0x80;
      local_358 = local_358 + 1;
    }
    *local_358 = (byte)local_350;
    local_88 = (EpsCopyOutputStream *)(local_358 + 1);
    for (local_7c = uVar3; 0x7f < local_7c; local_7c = local_7c >> 7) {
      *(byte *)local_88 = (byte)local_7c | 0x80;
      local_88 = (EpsCopyOutputStream *)((long)local_88 + 1);
    }
    local_c38 = (EpsCopyOutputStream *)((long)local_88 + 1);
    *(byte *)local_88 = (byte)local_7c;
    local_358 = local_358 + 1;
    local_88 = local_c38;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_16 = piVar12;
    do {
      local_c10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_c38);
      piVar14 = end_16 + 1;
      for (local_c08 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_16);
          0x7f < local_c08; local_c08 = local_c08 >> 7) {
        *local_c10 = (byte)local_c08 | 0x80;
        local_c10 = local_c10 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_c10 + 1);
      *local_c10 = (byte)local_c08;
      end_16 = piVar14;
      local_c38 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_small_0_hifield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_small_0_hifield(this);
    local_330 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_324 = 0xf4243;
    local_328 = 2;
    local_349 = 0;
    local_320 = stream;
    if (stream->end_ <= local_330) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_348,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_349 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_348);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_331,pLVar13);
    }
    if ((local_349 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_348);
    }
    local_318 = local_330;
    for (local_310 = local_324 << 3 | local_328; 0x7f < local_310; local_310 = local_310 >> 7) {
      *local_318 = (byte)local_310 | 0x80;
      local_318 = local_318 + 1;
    }
    *local_318 = (byte)local_310;
    local_78 = (EpsCopyOutputStream *)(local_318 + 1);
    for (local_6c = uVar3; 0x7f < local_6c; local_6c = local_6c >> 7) {
      *(byte *)local_78 = (byte)local_6c | 0x80;
      local_78 = (EpsCopyOutputStream *)((long)local_78 + 1);
    }
    local_be8 = (EpsCopyOutputStream *)((long)local_78 + 1);
    *(byte *)local_78 = (byte)local_6c;
    local_318 = local_318 + 1;
    local_78 = local_be8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_17 = piVar12;
    do {
      local_bc0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_be8);
      piVar14 = end_17 + 1;
      for (local_bb8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_17);
          0x7f < local_bb8; local_bb8 = local_bb8 >> 7) {
        *local_bc0 = (byte)local_bb8 | 0x80;
        local_bc0 = local_bc0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_bc0 + 1);
      *local_bc0 = (byte)local_bb8;
      end_17 = piVar14;
      local_be8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x20) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar5 = _internal_optional_seq_small_1_hifield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (0xf4244,EVar5,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_small_1_hifield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_small_1_hifield(this);
    local_2f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_2e4 = 0xf4245;
    local_2e8 = 2;
    local_309 = 0;
    local_2e0 = stream;
    if (stream->end_ <= local_2f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_308,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_309 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_308);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_2f1,pLVar13);
    }
    if ((local_309 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_308);
    }
    local_2d8 = local_2f0;
    for (local_2d0 = local_2e4 << 3 | local_2e8; 0x7f < local_2d0; local_2d0 = local_2d0 >> 7) {
      *local_2d8 = (byte)local_2d0 | 0x80;
      local_2d8 = local_2d8 + 1;
    }
    *local_2d8 = (byte)local_2d0;
    local_68 = (EpsCopyOutputStream *)(local_2d8 + 1);
    for (local_5c = uVar3; 0x7f < local_5c; local_5c = local_5c >> 7) {
      *(byte *)local_68 = (byte)local_5c | 0x80;
      local_68 = (EpsCopyOutputStream *)((long)local_68 + 1);
    }
    local_b98 = (EpsCopyOutputStream *)((long)local_68 + 1);
    *(byte *)local_68 = (byte)local_5c;
    local_2d8 = local_2d8 + 1;
    local_68 = local_b98;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_18 = piVar12;
    do {
      local_b70 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_b98);
      piVar14 = end_18 + 1;
      for (local_b68 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_18);
          0x7f < local_b68; local_b68 = local_b68 >> 7) {
        *local_b70 = (byte)local_b68 | 0x80;
        local_b70 = local_b70 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_b70 + 1);
      *local_b70 = (byte)local_b68;
      end_18 = piVar14;
      local_b98 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_small_1_hifield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_small_1_hifield(this);
    local_2b0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_2a4 = 0xf4246;
    local_2a8 = 2;
    local_2c9 = 0;
    local_2a0 = stream;
    if (stream->end_ <= local_2b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_2c9 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_2c8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_2b1,pLVar13);
    }
    if ((local_2c9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_2c8);
    }
    local_298 = local_2b0;
    for (local_290 = local_2a4 << 3 | local_2a8; 0x7f < local_290; local_290 = local_290 >> 7) {
      *local_298 = (byte)local_290 | 0x80;
      local_298 = local_298 + 1;
    }
    *local_298 = (byte)local_290;
    local_58 = (EpsCopyOutputStream *)(local_298 + 1);
    for (local_4c = uVar3; 0x7f < local_4c; local_4c = local_4c >> 7) {
      *(byte *)local_58 = (byte)local_4c | 0x80;
      local_58 = (EpsCopyOutputStream *)((long)local_58 + 1);
    }
    local_b48 = (EpsCopyOutputStream *)((long)local_58 + 1);
    *(byte *)local_58 = (byte)local_4c;
    local_298 = local_298 + 1;
    local_58 = local_b48;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_19 = piVar12;
    do {
      local_b20 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_b48);
      piVar14 = end_19 + 1;
      for (local_b18 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_19);
          0x7f < local_b18; local_b18 = local_b18 >> 7) {
        *local_b20 = (byte)local_b18 | 0x80;
        local_b20 = local_b20 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_b20 + 1);
      *local_b20 = (byte)local_b18;
      end_19 = piVar14;
      local_b48 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x800) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar6 = _internal_optional_seq_large_hifield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (0xf4247,EVar6,puVar10);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_seq_large_hifield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_repeated_seq_large_hifield(this);
    local_270 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_264 = 0xf4248;
    local_268 = 2;
    local_289 = 0;
    local_260 = stream;
    if (stream->end_ <= local_270) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_288,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_289 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_288);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_271,pLVar13);
    }
    if ((local_289 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_288);
    }
    local_258 = local_270;
    for (local_250 = local_264 << 3 | local_268; 0x7f < local_250; local_250 = local_250 >> 7) {
      *local_258 = (byte)local_250 | 0x80;
      local_258 = local_258 + 1;
    }
    *local_258 = (byte)local_250;
    local_48 = (EpsCopyOutputStream *)(local_258 + 1);
    for (local_3c = uVar3; 0x7f < local_3c; local_3c = local_3c >> 7) {
      *(byte *)local_48 = (byte)local_3c | 0x80;
      local_48 = (EpsCopyOutputStream *)((long)local_48 + 1);
    }
    local_af8 = (EpsCopyOutputStream *)((long)local_48 + 1);
    *(byte *)local_48 = (byte)local_3c;
    local_258 = local_258 + 1;
    local_48 = local_af8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_20 = piVar12;
    do {
      local_ad0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_af8);
      piVar14 = end_20 + 1;
      for (local_ac8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_20);
          0x7f < local_ac8; local_ac8 = local_ac8 >> 7) {
        *local_ad0 = (byte)local_ac8 | 0x80;
        local_ad0 = local_ad0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_ad0 + 1);
      *local_ad0 = (byte)local_ac8;
      end_20 = piVar14;
      local_af8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar3 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_seq_large_hifield_cached_byte_size_);
  if (uVar3 != 0) {
    pRVar11 = _internal_packed_seq_large_hifield(this);
    local_230 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_224 = 0xf4249;
    local_228 = 2;
    local_249 = 0;
    local_220 = stream;
    if (stream->end_ <= local_230) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_248,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_249 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_248);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_231,pLVar13);
    }
    if ((local_249 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_248);
    }
    local_218 = local_230;
    for (local_210 = local_224 << 3 | local_228; 0x7f < local_210; local_210 = local_210 >> 7) {
      *local_218 = (byte)local_210 | 0x80;
      local_218 = local_218 + 1;
    }
    *local_218 = (byte)local_210;
    local_38 = (EpsCopyOutputStream *)(local_218 + 1);
    for (local_2c = uVar3; 0x7f < local_2c; local_2c = local_2c >> 7) {
      *(byte *)local_38 = (byte)local_2c | 0x80;
      local_38 = (EpsCopyOutputStream *)((long)local_38 + 1);
    }
    local_aa8 = (EpsCopyOutputStream *)((long)local_38 + 1);
    *(byte *)local_38 = (byte)local_2c;
    local_218 = local_218 + 1;
    local_38 = local_aa8;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_21 = piVar12;
    do {
      local_a80 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_aa8);
      piVar14 = end_21 + 1;
      for (local_a78 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_21);
          0x7f < local_a78; local_a78 = local_a78 >> 7) {
        *local_a80 = (byte)local_a78 | 0x80;
        local_a80 = local_a80 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_a80 + 1);
      *local_a80 = (byte)local_a78;
      end_21 = piVar14;
      local_aa8 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  if ((uVar8 & 0x1000) != 0) {
    puVar10 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,(uint8_t *)stream_local)
    ;
    EVar7 = _internal_optional_arbitrary_hifield(this);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteEnumToArray
                             (0xf424a,EVar7,puVar10);
  }
  uVar8 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._repeated_arbitrary_hifield_cached_byte_size_);
  if (uVar8 != 0) {
    pRVar11 = _internal_repeated_arbitrary_hifield(this);
    local_1f0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_1e4 = 0xf424b;
    local_1e8 = 2;
    local_209 = 0;
    local_1e0 = stream;
    if (stream->end_ <= local_1f0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_208,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_209 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_208);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1f1,pLVar13);
    }
    if ((local_209 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_208);
    }
    local_1d8 = local_1f0;
    for (local_1d0 = local_1e4 << 3 | local_1e8; 0x7f < local_1d0; local_1d0 = local_1d0 >> 7) {
      *local_1d8 = (byte)local_1d0 | 0x80;
      local_1d8 = local_1d8 + 1;
    }
    *local_1d8 = (byte)local_1d0;
    local_28 = (EpsCopyOutputStream *)(local_1d8 + 1);
    for (local_1c = uVar8; 0x7f < local_1c; local_1c = local_1c >> 7) {
      *(byte *)local_28 = (byte)local_1c | 0x80;
      local_28 = (EpsCopyOutputStream *)((long)local_28 + 1);
    }
    local_a58 = (EpsCopyOutputStream *)((long)local_28 + 1);
    *(byte *)local_28 = (byte)local_1c;
    local_1d8 = local_1d8 + 1;
    local_28 = local_a58;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_22 = piVar12;
    do {
      local_a30 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_a58);
      piVar14 = end_22 + 1;
      for (local_a28 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_22);
          0x7f < local_a28; local_a28 = local_a28 >> 7) {
        *local_a30 = (byte)local_a28 | 0x80;
        local_a30 = local_a30 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_a30 + 1);
      *local_a30 = (byte)local_a28;
      end_22 = piVar14;
      local_a58 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  uVar8 = google::protobuf::internal::CachedSize::Get
                    (&(this->field_0)._impl_._packed_arbitrary_hifield_cached_byte_size_);
  if (uVar8 != 0) {
    pRVar11 = _internal_packed_arbitrary_hifield(this);
    local_1b0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    local_1a4 = 0xf424c;
    local_1a8 = 2;
    local_1c9 = 0;
    local_1a0 = stream;
    if (stream->end_ <= local_1b0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1c8,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/coded_stream.h"
                 ,0x355,"ptr < end_");
      local_1c9 = 1;
      pLVar13 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_1c8);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_1b1,pLVar13);
    }
    if ((local_1c9 & 1) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_1c8);
    }
    local_198 = local_1b0;
    for (local_18c = local_1a4 << 3 | local_1a8; 0x7f < local_18c; local_18c = local_18c >> 7) {
      *local_198 = (byte)local_18c | 0x80;
      local_198 = local_198 + 1;
    }
    *local_198 = (byte)local_18c;
    local_18 = (EpsCopyOutputStream *)(local_198 + 1);
    for (local_c = uVar8; 0x7f < local_c; local_c = local_c >> 7) {
      *(byte *)local_18 = (byte)local_c | 0x80;
      local_18 = (EpsCopyOutputStream *)((long)local_18 + 1);
    }
    local_a08 = (EpsCopyOutputStream *)((long)local_18 + 1);
    *(byte *)local_18 = (byte)local_c;
    local_198 = local_198 + 1;
    local_18 = local_a08;
    piVar12 = google::protobuf::RepeatedField<int>::data(pRVar11);
    iVar4 = google::protobuf::RepeatedField<int>::size(pRVar11);
    end_23 = piVar12;
    do {
      local_9e0 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                            (stream,(uint8_t *)local_a08);
      piVar14 = end_23 + 1;
      for (local_9d8 = google::protobuf::io::EpsCopyOutputStream::Encode64((long)*end_23);
          0x7f < local_9d8; local_9d8 = local_9d8 >> 7) {
        *local_9e0 = (byte)local_9d8 | 0x80;
        local_9e0 = local_9e0 + 1;
      }
      stream_local = (EpsCopyOutputStream *)(local_9e0 + 1);
      *local_9e0 = (byte)local_9d8;
      end_23 = piVar14;
      local_a08 = stream_local;
    } while (piVar14 < piVar12 + iVar4);
  }
  extendee = default_instance();
  stream_local = (EpsCopyOutputStream *)
                 google::protobuf::internal::ExtensionSet::_InternalSerializeAll
                           (&(this->field_0)._impl_._extensions_,(MessageLite *)extendee,
                            (uint8_t *)stream_local,stream);
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL EnumParseTester::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const EnumParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.EnumParseTester)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  cached_has_bits = this_._impl_._has_bits_[0];
  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_lowfield = 1;
  if ((cached_has_bits & 0x00000001u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1, this_._internal_optional_seq_small_0_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_lowfield = 2;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          2, this_._internal_repeated_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_lowfield = 3 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          3, this_._internal_packed_seq_small_0_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_lowfield = 4;
  if ((cached_has_bits & 0x00000002u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        4, this_._internal_optional_seq_small_1_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_lowfield = 5;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          5, this_._internal_repeated_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_lowfield = 6 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          6, this_._internal_packed_seq_small_1_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_lowfield = 7;
  if ((cached_has_bits & 0x00000080u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        7, this_._internal_optional_seq_large_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_lowfield = 8;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          8, this_._internal_repeated_seq_large_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_lowfield = 9 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          9, this_._internal_packed_seq_large_lowfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_lowfield = 10;
  if ((cached_has_bits & 0x00000100u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        10, this_._internal_optional_arbitrary_lowfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_lowfield = 11;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          11, this_._internal_repeated_arbitrary_lowfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_lowfield = 12 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_lowfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          12, this_._internal_packed_arbitrary_lowfield(), byte_size, target);
    }
  }

  // int32 other_field = 99;
  if ((cached_has_bits & 0x00000004u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        99, this_._internal_other_field(), target);
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_midfield = 1001;
  if ((cached_has_bits & 0x00000008u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1001, this_._internal_optional_seq_small_0_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_midfield = 1002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1002, this_._internal_repeated_seq_small_0_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_midfield = 1003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1003, this_._internal_packed_seq_small_0_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_midfield = 1004;
  if ((cached_has_bits & 0x00000040u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1004, this_._internal_optional_seq_small_1_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_midfield = 1005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1005, this_._internal_repeated_seq_small_1_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_midfield = 1006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1006, this_._internal_packed_seq_small_1_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_midfield = 1007;
  if ((cached_has_bits & 0x00000200u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1007, this_._internal_optional_seq_large_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_midfield = 1008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1008, this_._internal_repeated_seq_large_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_midfield = 1009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1009, this_._internal_packed_seq_large_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_midfield = 1010;
  if ((cached_has_bits & 0x00000400u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1010, this_._internal_optional_arbitrary_midfield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_midfield = 1011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1011, this_._internal_repeated_arbitrary_midfield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_midfield = 1012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_midfield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1012, this_._internal_packed_arbitrary_midfield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_hifield = 1000001;
  if ((cached_has_bits & 0x00000010u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000001, this_._internal_optional_seq_small_0_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_hifield = 1000002;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000002, this_._internal_repeated_seq_small_0_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_hifield = 1000003 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_0_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000003, this_._internal_packed_seq_small_0_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_hifield = 1000004;
  if ((cached_has_bits & 0x00000020u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000004, this_._internal_optional_seq_small_1_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_hifield = 1000005;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000005, this_._internal_repeated_seq_small_1_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_hifield = 1000006 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_small_1_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000006, this_._internal_packed_seq_small_1_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_hifield = 1000007;
  if ((cached_has_bits & 0x00000800u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000007, this_._internal_optional_seq_large_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_hifield = 1000008;
  {
    ::size_t byte_size = this_._impl_._repeated_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000008, this_._internal_repeated_seq_large_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_hifield = 1000009 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_seq_large_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000009, this_._internal_packed_seq_large_hifield(), byte_size, target);
    }
  }

  // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_hifield = 1000010;
  if ((cached_has_bits & 0x00001000u) != 0) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteEnumToArray(
        1000010, this_._internal_optional_arbitrary_hifield(), target);
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_hifield = 1000011;
  {
    ::size_t byte_size = this_._impl_._repeated_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000011, this_._internal_repeated_arbitrary_hifield(), byte_size, target);
    }
  }

  // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_hifield = 1000012 [features = {
  {
    ::size_t byte_size = this_._impl_._packed_arbitrary_hifield_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteEnumPacked(
          1000012, this_._internal_packed_arbitrary_hifield(), byte_size, target);
    }
  }

  // All extensions.
  target = this_._impl_._extensions_._InternalSerializeAll(&default_instance(),
                                                    target, stream);
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.EnumParseTester)
  return target;
}